

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

char * downlevel(char *filename)

{
  int iVar1;
  size_t sVar2;
  char *pcVar4;
  size_t sVar3;
  
  pcVar4 = pathname;
  if (pathname == (char *)0x0) {
    sVar2 = strlen(filename);
    iVar1 = (int)sVar2;
  }
  else {
    sVar2 = strlen(pathname);
    sVar3 = strlen(filename);
    iVar1 = (int)sVar3;
    if ((int)sVar2 != 0) {
      pcVar4 = (char *)realloc(pcVar4,(long)(iVar1 + (int)sVar2 + 2));
      if (pcVar4 == (char *)0x0) {
        pathname = pcVar4;
        return (char *)0x0;
      }
      pathname = pcVar4;
      sVar2 = strlen(pcVar4);
      (pcVar4 + sVar2)[0] = '/';
      (pcVar4 + sVar2)[1] = '\0';
      pcVar4 = strcat(pcVar4,filename);
      return pcVar4;
    }
  }
  pathname = (char *)malloc((long)(iVar1 + 1));
  if (pathname == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar4 = strcpy(pathname,filename);
  return pcVar4;
}

Assistant:

char *
downlevel(char *filename)
{
	register int len, flen;

	if (!pathname)
		len = 0;
	else
		len = strlen(pathname);

	flen = strlen(filename);
	if (!len)
	{
		pathname = malloc(flen + 1);
		if (pathname)
			strcpy(pathname, filename);
	}
	else
	{
		pathname = realloc(pathname, len + flen + 2);
		if (pathname)
		{
			strcat(pathname, PATHSEPSTR);
			strcat(pathname, filename);
		}
	}
	return (pathname);
}